

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::TPZParFrontMatrix(TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                    *this)

{
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  *unaff_retaddr;
  int64_t newsize;
  TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10> *this_00;
  TPZRegisterClassId *vtt;
  
  this_00 = (TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10> *)0x0;
  newsize = 0x21;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<std::complex<float>,TPZFileEqnStorage<std::complex<float>>,TPZFrontSym<std::complex<float>>>>
            (in_RDI,0x21);
  TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  ::TPZFrontMatrix(unaff_retaddr,(void **)vtt);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_02554440;
  TPZStack<TPZEqnArray<std::complex<float>_>_*,_10>::TPZStack
            ((TPZStack<TPZEqnArray<std::complex<float>_>_*,_10> *)(in_RDI + 0x250));
  *(undefined4 *)(in_RDI + 0x2c0) = 0;
  *(undefined8 *)(in_RDI + 0x2d8) = 0;
  *(undefined8 *)(in_RDI + 0x2e0) = 0;
  *(undefined8 *)(in_RDI + 0x2c8) = 0;
  *(undefined8 *)(in_RDI + 0x2d0) = 0;
  *(undefined8 *)(in_RDI + 0x2e8) = 0;
  std::mutex::mutex((mutex *)0x1d44089);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x2f0));
  TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>::Resize(this_00,newsize);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix():
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}